

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O0

GenericFunctionInstanceTypeResponse * __thiscall
SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
::find(SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
       *this,GenericFunctionInstanceTypeRequest *key)

{
  Node *pNVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  GenericFunctionInstanceTypeRequest local_70;
  Node *local_38;
  Node *item;
  uint i;
  uint local_24;
  uint bucket;
  uint bucketMask;
  GenericFunctionInstanceTypeRequest *key_local;
  SmallDenseMap<GenericFunctionInstanceTypeRequest,_GenericFunctionInstanceTypeResponse,_GenericFunctionInstanceTypeRequestHasher,_32U>
  *this_local;
  
  local_24 = this->bucketCount - 1;
  _bucket = key;
  key_local = (GenericFunctionInstanceTypeRequest *)this;
  uVar3 = GenericFunctionInstanceTypeRequestHasher::operator()
                    ((GenericFunctionInstanceTypeRequestHasher *)((long)&item + 7),key);
  i = uVar3 & local_24;
  item._0_4_ = 0;
  while( true ) {
    if (this->bucketCount <= (uint)item) {
      return (GenericFunctionInstanceTypeResponse *)0x0;
    }
    pNVar1 = this->data;
    uVar4 = (ulong)i;
    local_38 = pNVar1 + uVar4;
    GenericFunctionInstanceTypeRequest::GenericFunctionInstanceTypeRequest(&local_70);
    bVar2 = GenericFunctionInstanceTypeRequest::operator==(&pNVar1[uVar4].key,&local_70);
    if (bVar2) break;
    bVar2 = GenericFunctionInstanceTypeRequest::operator==(&local_38->key,_bucket);
    if (bVar2) {
      return &local_38->value;
    }
    i = i + (uint)item + 1 & local_24;
    item._0_4_ = (uint)item + 1;
  }
  return (GenericFunctionInstanceTypeResponse *)0x0;
}

Assistant:

Value* find(const Key& key) const
	{
		unsigned bucketMask = bucketCount - 1;
		unsigned bucket = Hasher()(key) & bucketMask;

		for(unsigned i = 0; i < bucketCount; i++)
		{
			Node &item = data[bucket];

			if(item.key == Key())
				return NULL;

			if(item.key == key)
				return &item.value;

			// Quadratic probing
			bucket = (bucket + i + 1) & bucketMask;
		}

		return NULL;
	}